

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::FinishCommandList
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this)

{
  bool bVar1;
  size_t i;
  long lVar2;
  string msg;
  string local_30;
  
  if ((this->m_Desc).IsDeferred == false) {
    FormatString<char[59]>
              (&local_30,(char (*) [59])"FinishCommandList() is only allowed for deferred contexts."
              );
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"FinishCommandList",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x209);
    std::__cxx11::string::~string((string *)&local_30);
  }
  bVar1 = IsRecordingDeferredCommands(this);
  if (!bVar1) {
    FormatString<char[85]>
              (&local_30,
               (char (*) [85])
               "This context is not recording commands. Call Begin() before finishing the recording."
              );
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"FinishCommandList",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x20a);
    std::__cxx11::string::~string((string *)&local_30);
  }
  (this->m_DstImmediateContextId).m_Value = 0xff;
  (this->m_Desc).QueueType = COMMAND_QUEUE_TYPE_UNKNOWN;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    (this->m_Desc).TextureCopyGranularity[lVar2] = 0;
  }
  return;
}

Assistant:

void FinishCommandList()
    {
        DEV_CHECK_ERR(IsDeferred(), "FinishCommandList() is only allowed for deferred contexts.");
        DEV_CHECK_ERR(IsRecordingDeferredCommands(), "This context is not recording commands. Call Begin() before finishing the recording.");
        m_DstImmediateContextId = INVALID_CONTEXT_ID;
        m_Desc.QueueType        = COMMAND_QUEUE_TYPE_UNKNOWN;
        for (size_t i = 0; i < _countof(m_Desc.TextureCopyGranularity); ++i)
            m_Desc.TextureCopyGranularity[i] = 0;
    }